

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[115],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [115],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1,
          char (*Args_2) [18],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_3,
          char (*Args_4) [19])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[115],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [115])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
             (char (*) [18])Args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_2,
             (char (*) [19])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}